

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O3

bool __thiscall lf::mesh::hybrid2d::Mesh::Contains(Mesh *this,Entity *e)

{
  pointer pTVar1;
  pointer pTVar2;
  pointer pQVar3;
  int iVar4;
  pointer pQVar5;
  
  iVar4 = (**e->_vptr_Entity)(e);
  if (iVar4 == 2) {
    if ((this->points_).
        super__Vector_base<lf::mesh::hybrid2d::Point,_std::allocator<lf::mesh::hybrid2d::Point>_>.
        _M_impl.super__Vector_impl_data._M_start <= e) {
      pQVar5 = (pointer)((this->points_).
                         super__Vector_base<lf::mesh::hybrid2d::Point,_std::allocator<lf::mesh::hybrid2d::Point>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1);
LAB_00116d31:
      return e <= pQVar5;
    }
  }
  else if (iVar4 == 1) {
    if ((this->segments_).
        super__Vector_base<lf::mesh::hybrid2d::Segment,_std::allocator<lf::mesh::hybrid2d::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start <= e) {
      pQVar5 = (pointer)((this->segments_).
                         super__Vector_base<lf::mesh::hybrid2d::Segment,_std::allocator<lf::mesh::hybrid2d::Segment>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1);
      goto LAB_00116d31;
    }
  }
  else if (iVar4 == 0) {
    pTVar1 = (this->trias_).
             super__Vector_base<lf::mesh::hybrid2d::Triangle,_std::allocator<lf::mesh::hybrid2d::Triangle>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (this->trias_).
             super__Vector_base<lf::mesh::hybrid2d::Triangle,_std::allocator<lf::mesh::hybrid2d::Triangle>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (e <= pTVar2 + -1 && (pTVar1 <= e && pTVar1 != pTVar2)) {
      return true;
    }
    pQVar3 = (this->quads_).
             super__Vector_base<lf::mesh::hybrid2d::Quadrilateral,_std::allocator<lf::mesh::hybrid2d::Quadrilateral>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pQVar5 = (this->quads_).
             super__Vector_base<lf::mesh::hybrid2d::Quadrilateral,_std::allocator<lf::mesh::hybrid2d::Quadrilateral>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pQVar3 <= e && pQVar3 != pQVar5) {
      pQVar5 = pQVar5 + -1;
      goto LAB_00116d31;
    }
  }
  return false;
}

Assistant:

bool Mesh::Contains(const Entity &e) const {
  switch (e.Codim()) {
    case 0:
      return (!trias_.empty() && &e >= &trias_.front() &&
              &e <= &trias_.back()) ||
             (!quads_.empty() && &e >= &quads_.front() && &e <= &quads_.back());
    case 1:
      return &e >= &segments_.front() && &e <= &segments_.back();
    case 2:
      return &e >= &points_.front() && &e <= &points_.back();
    default:
      return false;
  }
}